

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnDataSegmentData
          (BinaryReaderInterp *this,Index index,void *src_data,Address size)

{
  pointer pDVar1;
  
  if (size != 0) {
    pDVar1 = (this->module_->datas).
             super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&pDVar1[-1].data,size);
    memcpy(pDVar1[-1].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start,src_data,size);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderInterp::OnDataSegmentData(Index index,
                                             const void* src_data,
                                             Address size) {
  DataDesc& dst_data = module_.datas.back();
  if (size > 0) {
    dst_data.data.resize(size);
    memcpy(dst_data.data.data(), src_data, size);
  }
  return Result::Ok;
}